

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O1

void doREPL(lua_State *L)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  int status;
  char *pcVar5;
  char *pcVar6;
  size_t size;
  char *pcVar7;
  size_t local_40;
  ulong local_38;
  
  pcVar2 = progname;
  progname = (char *)0x0;
  _rl_readline_name = "lua";
  do {
    lua_settop(L,0);
    iVar3 = pushline(L,1);
    status = -1;
    if (iVar3 != 0) {
      pcVar5 = lua_tolstring(L,-1,(size_t *)0x0);
      pcVar6 = lua_pushfstring(L,"return %s;",pcVar5);
      size = strlen(pcVar6);
      iVar3 = luaL_loadbufferx(L,pcVar6,size,"=stdin",(char *)0x0);
      if (iVar3 == 0) {
        lua_rotate(L,-2,-1);
        lua_settop(L,-2);
        if (*pcVar5 != '\0') {
          add_history(pcVar5);
        }
      }
      else {
        lua_settop(L,-3);
      }
      if (iVar3 == 0) {
        status = 0;
      }
      else {
        do {
          pcVar6 = lua_tolstring(L,1,&local_40);
          uVar4 = luaL_loadbufferx(L,pcVar6,local_40,"=stdin",(char *)0x0);
          if (((uVar4 == 3) && (pcVar7 = lua_tolstring(L,-1,&local_38), 4 < local_38)) &&
             (iVar3 = strcmp(pcVar7 + (local_38 - 5),"<eof>"), iVar3 == 0)) {
            lua_settop(L,-2);
            iVar3 = pushline(L,0);
            if (iVar3 == 0) goto LAB_0010679f;
            lua_pushstring(L,anon_var_dwarf_aaab + 5);
            lua_rotate(L,-2,1);
            lua_concat(L,3);
            bVar1 = true;
          }
          else {
LAB_0010679f:
            add_history(pcVar6);
            bVar1 = false;
            pcVar5 = (char *)(ulong)uVar4;
          }
          status = (int)pcVar5;
        } while (bVar1);
      }
      lua_rotate(L,1,-1);
      lua_settop(L,-2);
    }
    if (status == 0) {
      status = docall(L,0,-1);
    }
    else if (status == -1) {
      lua_settop(L,0);
      fputc(10,_stdout);
      fflush(_stdout);
      progname = pcVar2;
      return;
    }
    if (status == 0) {
      iVar3 = lua_gettop(L);
      if (0 < iVar3) {
        luaL_checkstack(L,0x14,"too many results to print");
        lua_getglobal(L,"print");
        lua_rotate(L,1,1);
        iVar3 = lua_pcallk(L,iVar3,0,0,0,(lua_KFunction)0x0);
        if (iVar3 != 0) {
          doREPL_cold_1();
        }
      }
    }
    else {
      report(L,status);
    }
  } while( true );
}

Assistant:

static void doREPL (lua_State *L) {
  int status;
  const char *oldprogname = progname;
  progname = NULL;  /* no 'progname' on errors in interactive mode */
  lua_initreadline(L);
  while ((status = loadline(L)) != -1) {
    if (status == LUA_OK)
      status = docall(L, 0, LUA_MULTRET);
    if (status == LUA_OK) l_print(L);
    else report(L, status);
  }
  lua_settop(L, 0);  /* clear stack */
  lua_writeline();
  progname = oldprogname;
}